

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O1

int MPIABI_File_open(MPIABI_Comm comm,char *filename,int amode,MPIABI_Info info,MPIABI_File *fh)

{
  int iVar1;
  
  iVar1 = MPI_File_open();
  return iVar1;
}

Assistant:

int MPIABI_File_open(
  MPIABI_Comm comm,
  const char * filename,
  int amode,
  MPIABI_Info info,
  MPIABI_File * fh
) {
  return MPI_File_open(
    (MPI_Comm)(WPI_Comm)comm,
    filename,
    amode,
    (MPI_Info)(WPI_Info)info,
    (MPI_File *)(WPI_FilePtr)fh
  );
}